

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O3

void __thiscall de::BlockBufferBasicTest::Producer::run(Producer *this)

{
  uint uVar1;
  deUint32 dVar2;
  deBool dVar3;
  size_t in_RCX;
  uint __fd;
  ulong uVar4;
  int iVar5;
  int iVar6;
  Random rnd;
  Message tmpBuf [64];
  deRandom dStack_148;
  uint local_138 [66];
  
  deSleep(1);
  deRandom_init(&dStack_148,(uint)this->m_threadId);
  iVar5 = 0;
  memset(local_138,0,0x100);
  iVar6 = this->m_numMessages;
  if (0 < iVar6) {
    do {
      uVar1 = iVar6 - iVar5;
      if (0x3f < iVar6 - iVar5) {
        uVar1 = 0x40;
      }
      dVar2 = deRandom_getUint32(&dStack_148);
      __fd = dVar2 % uVar1 + 1;
      if (dVar2 % uVar1 < 0x7fffffff) {
        iVar6 = *(int *)&this->m_threadId;
        in_RCX = (size_t)__fd;
        uVar4 = 0;
        do {
          local_138[uVar4] = iVar5 + (int)uVar4 & 0xffffU | iVar6 << 0x10;
          uVar4 = uVar4 + 1;
        } while (uVar4 < in_RCX);
        iVar5 = iVar5 + (int)uVar4;
      }
      BlockBuffer<de::BlockBufferBasicTest::Message>::write(this->m_buffer,__fd,local_138,in_RCX);
      dVar3 = deRandom_getBool(&dStack_148);
      if (dVar3 == 1) {
        BlockBuffer<de::BlockBufferBasicTest::Message>::flush(this->m_buffer);
      }
      iVar6 = this->m_numMessages;
    } while (iVar5 < iVar6);
  }
  return;
}

Assistant:

void run (void)
	{
		// Yield to give main thread chance to start other producers.
		deSleep(1);

		Random	rnd		(m_threadId);
		int		msgNdx	= 0;
		Message	tmpBuf[64];

		while (msgNdx < m_numMessages)
		{
			int writeSize = rnd.getInt(1, de::min(m_numMessages-msgNdx, DE_LENGTH_OF_ARRAY(tmpBuf)));
			for (int ndx = 0; ndx < writeSize; ndx++)
				tmpBuf[ndx] = Message(m_threadId, (deUint16)msgNdx++);

			m_buffer.write(writeSize, &tmpBuf[0]);
			if (rnd.getBool())
				m_buffer.flush();
		}
	}